

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

void __thiscall
ddd::DaTrie<false,_false,_true>::delete_prefix_leaf(DaTrie<false,_false,_true> *this,Query *query)

{
  bool bVar1;
  uint32_t uVar2;
  size_type sVar3;
  reference pvVar4;
  vector<ddd::Block,_std::allocator<ddd::Block>_> *blocks;
  DaTrie<false,_false,_true> *in_RSI;
  DaTrie<false,_false,_true> *in_RDI;
  size_t edge_size;
  uint32_t parent_pos;
  undefined4 in_stack_ffffffffffffffe8;
  DaTrie<false,_false,_true> *this_00;
  
  this_00 = in_RDI;
  uVar2 = Query::node_pos((Query *)in_RSI);
  sVar3 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::size(&in_RDI->bc_);
  if (sVar3 <= uVar2) {
    __assert_fail("query.node_pos() < bc_.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                  ,0x11c,
                  "void ddd::DaTrie<false, false, true>::delete_prefix_leaf(Query &) [WithBLM = false, WithNLM = false, Prefix = true]"
                 );
  }
  uVar2 = Query::node_pos((Query *)in_RSI);
  pvVar4 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](&in_RDI->bc_,(ulong)uVar2);
  bVar1 = Bc::is_leaf(pvVar4);
  if (!bVar1) {
    __assert_fail("bc_[query.node_pos()].is_leaf()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                  ,0x11d,
                  "void ddd::DaTrie<false, false, true>::delete_prefix_leaf(Query &) [WithBLM = false, WithNLM = false, Prefix = true]"
                 );
  }
  uVar2 = Query::node_pos((Query *)in_RSI);
  pvVar4 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](&in_RDI->bc_,(ulong)uVar2);
  uVar2 = Bc::check(pvVar4);
  blocks = (vector<ddd::Block,_std::allocator<ddd::Block>_> *)
           edge_size_(this_00,(uint32_t)((ulong)in_RSI >> 0x20),
                      CONCAT44(uVar2,in_stack_ffffffffffffffe8));
  if (blocks != (vector<ddd::Block,_std::allocator<ddd::Block>_> *)0x0) {
    Query::node_pos((Query *)in_RSI);
    unfix_(in_RSI,uVar2,blocks);
    if (blocks == (vector<ddd::Block,_std::allocator<ddd::Block>_> *)0x1) {
      pvVar4 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](&in_RDI->bc_,(ulong)uVar2)
      ;
      Bc::set_base(pvVar4,0x7fffffff);
    }
    return;
  }
  __assert_fail("edge_size != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                ,0x122,
                "void ddd::DaTrie<false, false, true>::delete_prefix_leaf(Query &) [WithBLM = false, WithNLM = false, Prefix = true]"
               );
}

Assistant:

void delete_prefix_leaf(Query& query) {
    assert(query.node_pos() < bc_.size());
    assert(bc_[query.node_pos()].is_leaf());
    assert(Prefix);

    auto parent_pos = bc_[query.node_pos()].check();
    auto edge_size = edge_size_(parent_pos, 2);
    assert(edge_size != 0);

    if (WithNLM) {
      delete_sib_(query.node_pos());
    }

    unfix_(query.node_pos(), blocks_);
    if (edge_size == 1) {
      bc_[parent_pos].set_base(INVALID_VALUE);
    }
  }